

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Finalize<duckdb::FirstState<duckdb::string_t>,duckdb::string_t,duckdb::FirstFunctionString<true,false>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  data_ptr_t pdVar1;
  AggregateFinalizeData *finalize_data_00;
  idx_t iVar2;
  FirstState<duckdb::string_t> *state;
  AggregateFinalizeData finalize_data;
  anon_union_16_2_67f50693_for_value local_48;
  long local_38;
  
  local_48._0_8_ = result;
  local_48.pointer.ptr = (char *)aggr_input_data;
  if (states->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    local_38 = 0;
    FirstFunctionString<true,false>::Finalize<duckdb::string_t,duckdb::FirstState<duckdb::string_t>>
              (*(FirstFunctionString<true,false> **)states->data,
               (FirstState<duckdb::string_t> *)result->data,(string_t *)&local_48.pointer,
               (AggregateFinalizeData *)count);
  }
  else {
    finalize_data_00 = (AggregateFinalizeData *)count;
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = states->data;
    if (count != 0) {
      state = (FirstState<duckdb::string_t> *)(result->data + offset * 0x10);
      iVar2 = 0;
      do {
        local_38 = offset + iVar2;
        FirstFunctionString<true,false>::
        Finalize<duckdb::string_t,duckdb::FirstState<duckdb::string_t>>
                  (*(FirstFunctionString<true,false> **)(pdVar1 + iVar2 * 8),state,
                   (string_t *)&local_48.pointer,finalize_data_00);
        iVar2 = iVar2 + 1;
        state = (FirstState<duckdb::string_t> *)&state->is_set;
      } while (count != iVar2);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}